

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O2

void strict_fstream::detail::static_method_holder::check_peek
               (istream *is_p,string *filename,openmode mode)

{
  Exception *this;
  openmode mode_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::istream::peek();
  if (((&is_p->field_0x20)[(long)is_p->_vptr_basic_istream[-3]] & 5) == 0) {
    std::ios::clear((int)is_p + (int)is_p->_vptr_basic_istream[-3]);
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_e0,"strict_fstream: open(\'",&local_121);
  std::operator+(&local_c0,&local_e0,filename);
  std::operator+(&local_a0,&local_c0,"\',");
  mode_to_string_abi_cxx11_(&local_100,(static_method_holder *)(ulong)(uint)mode,mode_00);
  std::operator+(&local_80,&local_a0,&local_100);
  __lhs = &local_80;
  std::operator+(&local_60,__lhs,"): peek failed: ");
  strerror_abi_cxx11_((strict_fstream *)&local_120,(int)__lhs);
  std::operator+(&local_40,&local_60,&local_120);
  Exception::Exception(this,&local_40);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void check_peek(std::istream * is_p, const std::string& filename, std::ios_base::openmode mode)
    {
        bool peek_failed = true;
        try
        {
            is_p->peek();
            peek_failed = is_p->fail();
        }
        catch (const std::ios_base::failure &) {}
        if (peek_failed)
        {
            throw Exception(std::string("strict_fstream: open('")
                            + filename + "'," + mode_to_string(mode) + "): peek failed: "
                            + strerror());
        }
        is_p->clear();
    }